

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

TParameter * __thiscall glslang::TParameter::copyParam(TParameter *this,TParameter *param)

{
  int iVar1;
  TString *pTVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  void *extraout_RDX;
  TParameter *pTVar3;
  void *in_R8;
  
  pTVar3 = param;
  if (param->name == (TString *)0x0) {
    pTVar2 = (TString *)0x0;
  }
  else {
    pTVar2 = NewPoolTString_abi_cxx11_((param->name->_M_dataplus)._M_p);
    in_RDX = extraout_RDX;
  }
  this->name = pTVar2;
  iVar1 = TType::clone(param->type,(__fn *)pTVar3,in_RDX,in_ECX,in_R8);
  this->type = (TType *)CONCAT44(extraout_var,iVar1);
  this->defaultValue = param->defaultValue;
  return this;
}

Assistant:

TParameter& copyParam(const TParameter& param)
    {
        if (param.name)
            name = NewPoolTString(param.name->c_str());
        else
            name = nullptr;
        type = param.type->clone();
        defaultValue = param.defaultValue;
        return *this;
    }